

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTestTest.cpp
# Opt level: O2

string * __thiscall
NamedTestText::asString_abi_cxx11_(string *__return_storage_ptr__,NamedTestText *this)

{
  __uniq_ptr_impl<const_oout::Result,_std::default_delete<const_oout::Result>_> local_40;
  shared_ptr<const_oout::Result> local_38;
  XmlReportText local_28;
  
  (*((this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Test[2])(&local_40);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)&local_40);
  oout::XmlReportText::XmlReportText(&local_28,&local_38);
  oout::XmlReportText::asString_abi_cxx11_(__return_storage_ptr__,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.result.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_40._M_t.
      super__Tuple_impl<0UL,_const_oout::Result_*,_std::default_delete<const_oout::Result>_>.
      super__Head_base<0UL,_const_oout::Result_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_const_oout::Result_*,_std::default_delete<const_oout::Result>_>)0x0) {
    (*(*(_func_int ***)
        local_40._M_t.
        super__Tuple_impl<0UL,_const_oout::Result_*,_std::default_delete<const_oout::Result>_>.
        super__Head_base<0UL,_const_oout::Result_*,_false>._M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

string asString() const override
	{
		return XmlReportText(test->result()).asString();
	}